

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O0

void __thiscall
ftxui::SliderBase<float>::SliderBase
          (SliderBase<float> *this,ConstStringRef *label,float *value,float min,float max,
          float increment)

{
  float increment_local;
  float max_local;
  float min_local;
  float *value_local;
  ConstStringRef *label_local;
  SliderBase<float> *this_local;
  
  ComponentBase::ComponentBase(&this->super_ComponentBase);
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__SliderBase_00219c80;
  ConstStringRef::ConstStringRef(&this->label_,label);
  this->value_ = value;
  this->min_ = min;
  this->max_ = max;
  this->increment_ = increment;
  Box::Box(&this->box_);
  Box::Box(&this->gauge_box_);
  std::unique_ptr<ftxui::CapturedMouseInterface,std::default_delete<ftxui::CapturedMouseInterface>>
  ::unique_ptr<std::default_delete<ftxui::CapturedMouseInterface>,void>
            ((unique_ptr<ftxui::CapturedMouseInterface,std::default_delete<ftxui::CapturedMouseInterface>>
              *)&this->captured_mouse_);
  return;
}

Assistant:

SliderBase(ConstStringRef label, T* value, T min, T max, T increment)
      : label_(label),
        value_(value),
        min_(min),
        max_(max),
        increment_(increment) {}